

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void sarimax_setParams(sarimax_object obj,double *phi,double *theta,double *PHI,double *THETA)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (0 < obj->p) {
    uVar1 = (ulong)(uint)obj->p;
  }
  if (phi == (double *)0x0) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->phi[uVar2] = 0.0;
    }
  }
  else {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->phi[uVar2] = phi[uVar2];
    }
  }
  uVar1 = 0;
  if (0 < obj->q) {
    uVar1 = (ulong)(uint)obj->q;
  }
  if (theta == (double *)0x0) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->theta[uVar2] = 0.0;
    }
  }
  else {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->theta[uVar2] = theta[uVar2];
    }
  }
  uVar1 = 0;
  if (0 < obj->P) {
    uVar1 = (ulong)(uint)obj->P;
  }
  if (PHI == (double *)0x0) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->PHI[uVar2] = 0.0;
    }
  }
  else {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->PHI[uVar2] = PHI[uVar2];
    }
  }
  uVar1 = 0;
  if (0 < obj->Q) {
    uVar1 = (ulong)(uint)obj->Q;
  }
  uVar2 = 0;
  if (THETA == (double *)0x0) {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->THETA[uVar2] = 0.0;
    }
  }
  else {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      obj->THETA[uVar2] = THETA[uVar2];
    }
  }
  obj->start = 1;
  return;
}

Assistant:

void sarimax_setParams(sarimax_object obj, double *phi, double *theta, double *PHI, double *THETA) {
	int i;
	if (phi) {
		for (i = 0; i < obj->p;++i) {
			obj->phi[i] = phi[i];
		}
	} else {
		for (i = 0; i < obj->p;++i) {
			obj->phi[i] = 0.0;
		}
	}

	if (theta) {
		for (i = 0; i < obj->q;++i) {
			obj->theta[i] = theta[i];
		}
	} else {
		for (i = 0; i < obj->q;++i) {
			obj->theta[i] = 0.0;
		}
	}

	if (PHI) {
		for (i = 0; i < obj->P;++i) {
			obj->PHI[i] = PHI[i];
		}
	} else {
		for (i = 0; i < obj->P;++i) {
			obj->PHI[i] = 0.0;
		}
	}

	if (THETA) {
		for (i = 0; i < obj->Q;++i) {
			obj->THETA[i] = THETA[i];
		}
	} else {
		for (i = 0; i < obj->Q;++i) {
			obj->THETA[i] = 0.0;
		}
	}

	obj->start = 1;
}